

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassBuilder.cpp
# Opt level: O1

void __thiscall Lodtalk::ClassBuilder::createMetaclassMethodDict(ClassBuilder *this)

{
  undefined8 *puVar1;
  MethodDictionary *pMVar2;
  __node_base *p_Var3;
  OopRef method;
  OopRef selector;
  anon_union_8_4_0eb573b0_for_Oop_0 local_58;
  VMContext *local_50;
  anon_union_8_4_0eb573b0_for_Oop_0 local_38;
  VMContext *local_30;
  
  pMVar2 = MethodDictionary::basicNativeNew(this->context);
  puVar1 = (undefined8 *)(this->metaclass).reference.oop.field_0.uintValue;
  if (puVar1 != &NilObject) {
    puVar1[2] = pMVar2;
    local_30 = this->context;
    local_38.pointer = (uint8_t *)&NilObject;
    OopRef::registerSelf((OopRef *)&local_38);
    local_50 = this->context;
    local_58.pointer = (uint8_t *)&NilObject;
    OopRef::registerSelf((OopRef *)&local_58);
    p_Var3 = &(this->classSidePrimitiveMethods)._M_h._M_before_begin;
    while( true ) {
      p_Var3 = p_Var3->_M_nxt;
      if (p_Var3 == (__node_base *)0x0) {
        OopRef::unregisterSelf((OopRef *)&local_58);
        OopRef::unregisterSelf((OopRef *)&local_38);
        return;
      }
      local_38 = (anon_union_8_4_0eb573b0_for_Oop_0)
                 ByteSymbol::fromNative(this->context,(string *)(p_Var3 + 1));
      local_58.header =
           (ObjectHeader *)NativeMethod::create(this->context,(PrimitiveFunction)p_Var3[5]._M_nxt);
      puVar1 = (undefined8 *)(this->metaclass).reference.oop.field_0.uintValue;
      if (puVar1 == &NilObject) break;
      MethodDictionary::internalAtPut
                ((MethodDictionary *)puVar1[2],this->context,(Oop)local_38,(Oop)local_58);
    }
  }
  __assert_fail("!isNil()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/include/Lodtalk/ObjectModel.hpp"
                ,0x3bf,
                "T *Lodtalk::Ref<Lodtalk::Metaclass>::operator->() const [T = Lodtalk::Metaclass]");
}

Assistant:

void ClassBuilder::createMetaclassMethodDict()
{
    metaclass->methodDict = MethodDictionary::basicNativeNew(context);
    OopRef selector(context);
    OopRef method(context);
    for(auto &selectorAndMethod : classSidePrimitiveMethods)
    {
        selector = ByteSymbol::fromNative(context, selectorAndMethod.first);
        method = Oop::fromPointer(NativeMethod::create(context, selectorAndMethod.second));
        metaclass->methodDict->atPut(context, selector.oop, method.oop);
    }
}